

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyline.cpp
# Opt level: O0

ON_3dPoint * __thiscall
ON_Polyline::PointAt(ON_3dPoint *__return_storage_ptr__,ON_Polyline *this,double t)

{
  ON_3dPoint *pOVar1;
  double dVar2;
  ON_3dPoint local_50;
  ON_3dPoint local_38;
  int local_20;
  int local_1c;
  int segment_index;
  int count;
  double t_local;
  ON_Polyline *this_local;
  
  local_1c = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count;
  local_20 = 0;
  if (local_1c < 0) {
    __return_storage_ptr__->x = ON_3dPoint::Origin.x;
    __return_storage_ptr__->y = ON_3dPoint::Origin.y;
    __return_storage_ptr__->z = ON_3dPoint::Origin.z;
  }
  else if (local_1c == 1) {
    pOVar1 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a;
    __return_storage_ptr__->x = pOVar1->x;
    __return_storage_ptr__->y = pOVar1->y;
    __return_storage_ptr__->z = pOVar1->z;
  }
  else {
    _segment_index = t;
    t_local = (double)this;
    dVar2 = floor(t);
    local_20 = (int)dVar2;
    if (local_20 < 0) {
      local_20 = 0;
    }
    else if (local_20 < local_1c + -1) {
      _segment_index = _segment_index - (double)local_20;
    }
    else {
      local_20 = local_1c + -2;
      _segment_index = 1.0;
    }
    ::operator*(&local_38,1.0 - _segment_index,
                (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a + local_20);
    ::operator*(&local_50,_segment_index,
                (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a + (local_20 + 1))
    ;
    ON_3dPoint::operator+(__return_storage_ptr__,&local_38,&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

ON_3dPoint ON_Polyline::PointAt( double t ) const
{
  const int count = m_count;
  int segment_index = 0;
  if ( count < 0 ) {
    return ON_3dPoint::Origin;
  }
  else if (count == 1 ) {
    return m_a[0];
  }
  else {
    segment_index = (int)floor(t);
    if ( segment_index < 0 ) {
      segment_index = 0;
      //t = 0.0;
    }
    else if ( segment_index >= count-1 ) {
      segment_index = count-2;
      t = 1.0;//Note: This is not correct if the input t is greater than count-1.  It needs to be adjusted.
    }
    else {
      t -= ((double)segment_index);
    }
  }

  return (1-t)*m_a[segment_index] + t*m_a[segment_index+1];
}